

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O2

void fwrite_pet(CHAR_DATA *pet,FILE *fp)

{
  RACE_DATA *pRVar1;
  MOB_INDEX_DATA *pMVar2;
  
  fwrite("#PET\n",5,1,(FILE *)fp);
  fprintf((FILE *)fp,"Vnum %d\n",(ulong)(uint)(int)pet->pIndexData->vnum);
  fprintf((FILE *)fp,"Name %s~\n",pet->name);
  fprintf((FILE *)fp,"LogO %ld\n",current_time);
  pMVar2 = pet->pIndexData;
  if (pet->short_descr != pMVar2->short_descr) {
    fprintf((FILE *)fp,"ShD  %s~\n");
    pMVar2 = pet->pIndexData;
  }
  if (pet->long_descr != pMVar2->long_descr) {
    fprintf((FILE *)fp,"LnD  %s~\n");
    pMVar2 = pet->pIndexData;
  }
  if (pet->description != pMVar2->description) {
    fprintf((FILE *)fp,"Desc %s~\n");
    pMVar2 = pet->pIndexData;
  }
  if (pet->race != pMVar2->race) {
    pRVar1 = race_data_lookup((int)pet->race);
    fprintf((FILE *)fp,"Race %s~\n",pRVar1->name);
  }
  if ((long)pet->cabal != 0) {
    fprintf((FILE *)fp,"Cabal %s~\n",cabal_table[pet->cabal].name);
  }
  fprintf((FILE *)fp,"Sex  %d\n",(ulong)(uint)(int)pet->sex);
  if (pet->level != pet->pIndexData->level) {
    fprintf((FILE *)fp,"Levl %d\n");
  }
  fprintf((FILE *)fp,"HMV  %d %d %d %d %d %d\n",(ulong)(uint)pet->hit,(ulong)(uint)(int)pet->max_hit
          ,(ulong)(uint)(int)pet->mana,(ulong)(uint)(int)pet->max_mana,(int)pet->move,
          (int)pet->max_move);
  if (0 < pet->gold) {
    fprintf((FILE *)fp,"Gold %ld\n");
  }
  if (0 < pet->exp) {
    fprintf((FILE *)fp,"Exp  %d\n");
  }
  pMVar2 = pet->pIndexData;
  if (pet->act != pMVar2->act) {
    print_flags(pet->act);
    fprintf((FILE *)fp,"Act  %s\n",print_flags::buf);
    pMVar2 = pet->pIndexData;
  }
  if (pet->affected_by != pMVar2->affected_by) {
    print_flags(pet->affected_by);
    fprintf((FILE *)fp,"AfBy %s\n",print_flags::buf);
  }
  print_flags(pet->comm);
  fprintf((FILE *)fp,"Comm %s\n",print_flags::buf);
  pet->position = 8;
  fprintf((FILE *)fp,"Pos  %d\n",8);
  if (pet->saving_throw != 0) {
    fprintf((FILE *)fp,"Save %d\n");
  }
  pMVar2 = pet->pIndexData;
  if (pet->alignment != pMVar2->alignment) {
    fprintf((FILE *)fp,"Alig %d\n");
    pMVar2 = pet->pIndexData;
  }
  if (pet->hitroll != pMVar2->hitroll) {
    fprintf((FILE *)fp,"Hit  %d\n");
    pMVar2 = pet->pIndexData;
  }
  if (pet->damroll != pMVar2->damage[2]) {
    fprintf((FILE *)fp,"Dam  %d\n");
  }
  fprintf((FILE *)fp,"ACs  %d %d %d %d\n",(ulong)(uint)(int)pet->armor[0],
          (ulong)(uint)(int)pet->armor[1],(ulong)(uint)(int)pet->armor[2],
          (ulong)(uint)(int)pet->armor[3]);
  fprintf((FILE *)fp,"Attr %d %d %d %d %d\n",(ulong)(uint)(int)pet->perm_stat[0],
          (ulong)(uint)(int)pet->perm_stat[1],(ulong)(uint)(int)pet->perm_stat[2],
          (ulong)(uint)(int)pet->perm_stat[3],(int)pet->perm_stat[4]);
  fprintf((FILE *)fp,"AMod %d %d %d %d %d\n",(ulong)(uint)(int)pet->mod_stat[0],
          (ulong)(uint)(int)pet->mod_stat[1],(ulong)(uint)(int)pet->mod_stat[2],
          (ulong)(uint)(int)pet->mod_stat[3],(int)pet->mod_stat[4]);
  fwrite("End\n",4,1,(FILE *)fp);
  return;
}

Assistant:

void fwrite_pet(CHAR_DATA *pet, FILE *fp)
{
	fprintf(fp, "#PET\n");
	fprintf(fp, "Vnum %d\n", pet->pIndexData->vnum);
	fprintf(fp, "Name %s~\n", pet->name);
	fprintf(fp, "LogO %ld\n", current_time);

	if (pet->short_descr != pet->pIndexData->short_descr)
		fprintf(fp, "ShD  %s~\n", pet->short_descr);

	if (pet->long_descr != pet->pIndexData->long_descr)
		fprintf(fp, "LnD  %s~\n", pet->long_descr);

	if (pet->description != pet->pIndexData->description)
		fprintf(fp, "Desc %s~\n", pet->description);

	if (pet->race != pet->pIndexData->race)
		fprintf(fp, "Race %s~\n", race_data_lookup(pet->race)->name);

	if (pet->cabal)
		fprintf(fp, "Cabal %s~\n", cabal_table[pet->cabal].name);

	fprintf(fp, "Sex  %d\n", pet->sex);

	if (pet->level != pet->pIndexData->level)
		fprintf(fp, "Levl %d\n", pet->level);

	fprintf(fp, "HMV  %d %d %d %d %d %d\n", pet->hit, pet->max_hit, pet->mana, pet->max_mana, pet->move, pet->max_move);

	if (pet->gold > 0)
		fprintf(fp, "Gold %ld\n", pet->gold);

	if (pet->exp > 0)
		fprintf(fp, "Exp  %d\n", pet->exp);

	if (pet->act != pet->pIndexData->act)
		fprintf(fp, "Act  %s\n", print_flags(pet->act));

	if (pet->affected_by != pet->pIndexData->affected_by)
		fprintf(fp, "AfBy %s\n", print_flags(pet->affected_by));

	if (pet->comm != 0)
		fprintf(fp, "Comm %s\n", print_flags(pet->comm));

	fprintf(fp, "Pos  %d\n", pet->position = POS_FIGHTING ? POS_STANDING : pet->position);

	if (pet->saving_throw != 0)
		fprintf(fp, "Save %d\n", pet->saving_throw);

	if (pet->alignment != pet->pIndexData->alignment)
		fprintf(fp, "Alig %d\n", pet->alignment);

	if (pet->hitroll != pet->pIndexData->hitroll)
		fprintf(fp, "Hit  %d\n", pet->hitroll);

	if (pet->damroll != pet->pIndexData->damage[DICE_BONUS])
		fprintf(fp, "Dam  %d\n", pet->damroll);

	fprintf(fp, "ACs  %d %d %d %d\n", pet->armor[0], pet->armor[1], pet->armor[2], pet->armor[3]);
	fprintf(fp, "Attr %d %d %d %d %d\n",
		pet->perm_stat[STAT_STR],
		pet->perm_stat[STAT_INT],
		pet->perm_stat[STAT_WIS],
		pet->perm_stat[STAT_DEX],
		pet->perm_stat[STAT_CON]);
	fprintf(fp, "AMod %d %d %d %d %d\n",
		pet->mod_stat[STAT_STR],
		pet->mod_stat[STAT_INT],
		pet->mod_stat[STAT_WIS],
		pet->mod_stat[STAT_DEX],
		pet->mod_stat[STAT_CON]);
	/*
	for ( paf = pet->affected; paf != nullptr; paf = paf->next )
	{
		if (paf->type < 0 || paf->type >= MAX_SKILL)
			continue;

		paf->aftype = isAftSpell(paf->aftype);

		fprintf(fp, "Affc '%s' %3d %3d %3d %3d %3d %s %3d %s '%s'\n",
			skill_table[paf->type].name,
			paf->where,
			paf->level,
			paf->duration,
			paf->modifier,
			paf->location,
			print_flags(paf->bitvector),
			paf->aftype,
			paf->owner ? paf->owner->name : "none",
			paf->name ? paf->name : "none");
	}
	 THIS IS VARY VARY BAD.
	*/

	fprintf(fp, "End\n");
}